

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,void **vtt,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  int *piVar5;
  long lVar6;
  long *plVar7;
  TPZConnect *this_00;
  TPZManVector<int,_3> *this_01;
  TPZGeoEl *in_RCX;
  TPZCompMesh *in_RDX;
  undefined8 *in_RSI;
  TPZCompElHDiv<pzshape::TPZShapePrism> *in_RDI;
  HDivFamily in_R8D;
  TPZManVector<int,_3> ord;
  int order_1;
  TPZMatSingleSpace *mat;
  int side;
  int firstside;
  TPZManVector<int,_3> order;
  int sideorder;
  int sideaux;
  int i;
  TPZStack<int,_10> facesides;
  int nconflux;
  int in_stack_fffffffffffffe2c;
  TPZManVector<int,_3> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  TPZStack<int,_10> *in_stack_fffffffffffffe40;
  TPZGeoEl *in_stack_fffffffffffffe48;
  TPZCompMesh *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  TPZIntelGen<pzshape::TPZShapePrism> *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffef4;
  TPZVec<int> *in_stack_fffffffffffffef8;
  TPZIntPrism3D *in_stack_ffffffffffffff00;
  int local_d8;
  int local_94;
  int in_stack_ffffffffffffff74;
  TPZGeoEl *in_stack_ffffffffffffff78;
  
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (in_stack_fffffffffffffe60,
             (void **)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  *(undefined8 *)
   &(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = *in_RSI;
  *(undefined8 *)
   (&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
     super_TPZInterpolationSpace.super_TPZCompEl.field_0x0 +
   *(long *)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
            -0x60)) = in_RSI[9];
  TPZManVector<int,_5>::TPZManVector
            ((TPZManVector<int,_5> *)in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (int *)in_stack_fffffffffffffe50);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a1292a);
  TPZManVector<long,_6>::TPZManVector
            ((TPZManVector<long,_6> *)in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (long *)in_stack_fffffffffffffe50);
  in_RDI->fhdivfam = in_R8D;
  iVar1 = TPZCompMesh::GetDefaultOrder(in_RDX);
  (in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = iVar1;
  NConnects(in_RDI);
  TPZManVector<long,_6>::Resize
            ((TPZManVector<long,_6> *)in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  TPZGeoEl::SetReference(in_RCX,(TPZCompEl *)in_RDI);
  TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffe40);
  pztopology::TPZPrism::LowerDimensionSides
            ((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
             (TPZStack<int,_10> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
             (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
  TPZStack<int,_10>::Push((TPZStack<int,_10> *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  for (local_94 = 0; iVar4 = TPZVec<int>::size((TPZVec<int> *)&stack0xffffffffffffff70),
      local_94 < iVar4; local_94 = local_94 + 1) {
    piVar5 = TPZVec<int>::operator[]((TPZVec<int> *)&stack0xffffffffffffff70,(long)local_94);
    iVar1 = *piVar5;
    lVar6 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(in_RDI,iVar1);
    plVar7 = TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_94);
    *plVar7 = lVar6;
    TPZCompMesh::ConnectVec(in_RDX);
    TPZVec<long>::operator[](&(in_RDI->fConnectIndexes).super_TPZVec<long>,(long)local_94);
    this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                        ((TPZChunkVector<TPZConnect,_10> *)in_stack_fffffffffffffe50,
                         (int64_t)in_stack_fffffffffffffe48);
    TPZConnect::IncrementElConnected(this_00);
    (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                           super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl
                + 0x378))(in_RDI,iVar1);
  }
  iVar1 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x338))(in_RDI,0x14);
  iVar2 = TPZIntPrism3D::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule);
  if (iVar2 < (iVar1 + 1) * 2) {
    TPZIntPrism3D::GetMaxOrder(&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).fIntRule);
  }
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_fffffffffffffe60,
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (int *)in_stack_fffffffffffffe50);
  TPZIntPrism3D::SetOrder
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  for (local_d8 = 0xf; local_d8 < 0x14; local_d8 = local_d8 + 1) {
    in_stack_fffffffffffffe60 =
         (TPZIntelGen<pzshape::TPZShapePrism> *)
         TPZCompEl::Reference
                   ((TPZCompEl *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffe5c =
         TPZGeoEl::NormalOrientation(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    in_stack_fffffffffffffe50 =
         (TPZCompMesh *)
         TPZVec<int>::operator[](&(in_RDI->fSideOrient).super_TPZVec<int>,(long)(local_d8 + -0xf));
    *(int *)in_stack_fffffffffffffe50 = in_stack_fffffffffffffe5c;
  }
  lVar6 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0xb8))();
  if (lVar6 == 0) {
    this_01 = (TPZManVector<int,_3> *)0x0;
  }
  else {
    this_01 = (TPZManVector<int,_3> *)
              __dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZMatSingleSpace::typeinfo,
                             0xfffffffffffffffe);
  }
  if (this_01 != (TPZManVector<int,_3> *)0x0) {
    uVar3 = (**(code **)(*(long *)&(in_RDI->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x268))();
    (*(this_01->super_TPZVec<int>)._vptr_TPZVec[0xb])(this_01,(ulong)uVar3);
    (**(code **)(*(long *)in_RCX + 0x210))();
    TPZManVector<int,_3>::TPZManVector
              ((TPZManVector<int,_3> *)in_stack_fffffffffffffe60,
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (int *)in_stack_fffffffffffffe50);
    TPZIntPrism3D::SetOrder
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    TPZManVector<int,_3>::~TPZManVector(this_01);
    in_stack_fffffffffffffe30 = this_01;
  }
  TPZManVector<int,_3>::~TPZManVector(in_stack_fffffffffffffe30);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1a12ee2);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel,1), fSideOrient(TSHAPE::NFacets,1), fhdivfam(hdivfam) {
	this->TPZInterpolationSpace::fPreferredOrder = mesh.GetDefaultOrder();
	int nconflux= TPZCompElHDiv::NConnects();
    this->fConnectIndexes.Resize(nconflux);
	gel->SetReference(this);

//    int nfaces = TSHAPE::NumSides(TSHAPE::Dimension-1);
    TPZStack<int> facesides;
    TSHAPE::LowerDimensionSides(TSHAPE::NSides-1,facesides,TSHAPE::Dimension-1);
    facesides.Push(TSHAPE::NSides-1);
	for(int i=0;i< facesides.size(); i++)
	{
        int sideaux= facesides[i];
		this->fConnectIndexes[i] = this->CreateMidSideConnect(sideaux);
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "After creating last flux connect " << i << std::endl;
            //	this->Print(sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

		mesh.ConnectVec()[this->fConnectIndexes[i]].IncrementElConnected();
		this->IdentifySideOrder(sideaux);
    }


    int sideorder = EffectiveSideOrder(TSHAPE::NSides-1);
//    if(TSHAPE::Type()==EQuadrilateral)
//    {
//        sideorder++;
//    }

    sideorder++;

	sideorder = 2*sideorder;
	if (sideorder > this->fIntRule.GetMaxOrder()) sideorder = this->fIntRule.GetMaxOrder();
	TPZManVector<int,3> order(3,sideorder);
	this->fIntRule.SetOrder(order);
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    for(int side = firstside ; side < TSHAPE::NSides-1; side++ )
    {
        fSideOrient[side-firstside] = this->Reference()->NormalOrientation(side);
    }
    auto *mat =
        dynamic_cast<TPZMatSingleSpace *>(this->Material());
    if (mat)
    {
        int order = mat->IntegrationRuleOrder(MaxOrder());
        TPZManVector<int,3> ord(gel->Dimension(),order);
        this->fIntRule.SetOrder(ord);
    }

    if (fhdivfam == HDivFamily::EHDivConstant) {
        // For HDiv constant, polynomial order was compatibilized in connectorders, 
        // see TPZShapeHDivConstant<TSHAPE>::Initialize. So now we need to update
        // the number of shape functions and also the integration rule
        if (TSHAPE::Type() == ETriangle || TSHAPE::Type() == EQuadrilateral || TSHAPE::Type() == ETetraedro){
            for (int icon = 0; icon < this->NConnects(); icon++)
            {
                TPZConnect &c = this->Connect(icon);
                int nShapeF = NConnectShapeF(icon,c.Order());
                if (c.NShape() != nShapeF){
                    DebugStop();
                }
            }
        }
    }
}